

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void mips_tr_tb_stop(DisasContextBase *dcbase,CPUState *cs)

{
  DisasJumpType DVar1;
  int iVar2;
  TCGContext_conflict6 *tcg_ctx_00;
  TCGArg a2;
  TCGArg a2_00;
  uint uVar3;
  TCGContext_conflict6 *tcg_ctx;
  TCGTemp *args [1];
  TCGTemp *local_18;
  
  tcg_ctx_00 = *(TCGContext_conflict6 **)(dcbase[4].pc_first + 0x2e8);
  DVar1 = dcbase->is_jmp;
  if (dcbase->singlestep_enabled != true) {
    switch(DVar1) {
    case DISAS_NEXT:
    case DISAS_TOO_MANY:
      iVar2 = (int)dcbase[2].pc_next;
      if (iVar2 != *(int *)((long)&dcbase[2].pc_next + 4)) {
        tcg_gen_op2_mips64el
                  (tcg_ctx_00,INDEX_op_movi_i32,(TCGArg)(tcg_ctx_00->hflags + (long)tcg_ctx_00),
                   (long)iVar2);
        uVar3 = (uint)dcbase[2].pc_next;
        *(uint *)((long)&dcbase[2].pc_next + 4) = uVar3;
        uVar3 = uVar3 & 0x803800;
        if (((uVar3 == 0x800) || (uVar3 == 0x1800)) || (uVar3 == 0x1000)) {
          a2_00._0_4_ = dcbase[2].is_jmp;
          a2_00._4_4_ = dcbase[2].num_insns;
          tcg_gen_op2_mips64el
                    (tcg_ctx_00,INDEX_op_movi_i64,(TCGArg)(tcg_ctx_00->btarget + (long)tcg_ctx_00),
                     a2_00);
        }
      }
      gen_goto_tb((DisasContext_conflict6 *)dcbase,0,dcbase->pc_next);
      return;
    case DISAS_NORETURN:
      goto switchD_0097d01b_caseD_2;
    case DISAS_TARGET_0:
      tcg_gen_op2_mips64el
                (tcg_ctx_00,INDEX_op_movi_i64,(TCGArg)(tcg_ctx_00->cpu_pc + (long)tcg_ctx_00),
                 dcbase->pc_next);
      tcg_gen_lookup_and_goto_ptr_mips64el(tcg_ctx_00);
      return;
    case DISAS_TARGET_1:
      tcg_gen_exit_tb_mips64el(tcg_ctx_00,(TranslationBlock *)0x0,0);
      return;
    default:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/translate.c"
                 ,0x7955,(char *)0x0);
    }
  }
  if (DVar1 != DISAS_NORETURN) {
    if ((DVar1 != DISAS_TARGET_1) && ((TranslationBlock *)dcbase->pc_next != dcbase[1].tb)) {
      tcg_gen_op2_mips64el
                (tcg_ctx_00,INDEX_op_movi_i64,(TCGArg)(tcg_ctx_00->cpu_pc + (long)tcg_ctx_00),
                 (TCGArg)dcbase->pc_next);
      dcbase[1].tb = (TranslationBlock *)dcbase->pc_next;
    }
    iVar2 = (int)dcbase[2].pc_next;
    if (iVar2 != *(int *)((long)&dcbase[2].pc_next + 4)) {
      tcg_gen_op2_mips64el
                (tcg_ctx_00,INDEX_op_movi_i32,(TCGArg)(tcg_ctx_00->hflags + (long)tcg_ctx_00),
                 (long)iVar2);
      uVar3 = (uint)dcbase[2].pc_next;
      *(uint *)((long)&dcbase[2].pc_next + 4) = uVar3;
      uVar3 = uVar3 & 0x803800;
      if (((uVar3 == 0x800) || (uVar3 == 0x1800)) || (uVar3 == 0x1000)) {
        a2._0_4_ = dcbase[2].is_jmp;
        a2._4_4_ = dcbase[2].num_insns;
        tcg_gen_op2_mips64el
                  (tcg_ctx_00,INDEX_op_movi_i64,(TCGArg)(tcg_ctx_00->btarget + (long)tcg_ctx_00),a2)
        ;
      }
    }
    local_18 = (TCGTemp *)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00);
    tcg_gen_callN_mips64el
              (tcg_ctx_00,helper_raise_exception_debug_mips64el,(TCGTemp *)0x0,1,&local_18);
  }
switchD_0097d01b_caseD_2:
  return;
}

Assistant:

static void mips_tr_tb_stop(DisasContextBase *dcbase, CPUState *cs)
{
    DisasContext *ctx = container_of(dcbase, DisasContext, base);
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    if (ctx->base.singlestep_enabled && ctx->base.is_jmp != DISAS_NORETURN) {
        save_cpu_state(ctx, ctx->base.is_jmp != DISAS_EXIT);
        gen_helper_raise_exception_debug(tcg_ctx, tcg_ctx->cpu_env);
    } else {
        switch (ctx->base.is_jmp) {
        case DISAS_STOP:
            gen_save_pc(tcg_ctx, ctx->base.pc_next);
            tcg_gen_lookup_and_goto_ptr(tcg_ctx);
            break;
        case DISAS_NEXT:
        case DISAS_TOO_MANY:
            save_cpu_state(ctx, 0);
            gen_goto_tb(ctx, 0, ctx->base.pc_next);
            break;
        case DISAS_EXIT:
            tcg_gen_exit_tb(tcg_ctx, NULL, 0);
            break;
        case DISAS_NORETURN:
            break;
        default:
            g_assert_not_reached();
        }
    }
}